

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool CLI::detail::is_separator(string *str)

{
  __type_conflict _Var1;
  int iVar2;
  allocator<char> local_9;
  
  if (is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_);
    if (iVar2 != 0) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_,"%%",&local_9)
      ;
      __cxa_atexit(::std::__cxx11::string::~string,
                   &is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_);
    }
  }
  if (str->_M_string_length == 0) {
    _Var1 = true;
  }
  else {
    _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_);
  }
  return _Var1;
}

Assistant:

inline bool is_separator(const std::string &str) {
    static const std::string sep("%%");
    return (str.empty() || str == sep);
}